

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O3

void Ivy_NodePrintCut(Ivy_Cut_t *pCut)

{
  long lVar1;
  
  if (0 < pCut->nSize) {
    printf("%d : {");
    if (0 < pCut->nSize) {
      lVar1 = 0;
      do {
        printf(" %d",(ulong)(uint)pCut->pArray[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < pCut->nSize);
    }
    puts(" }");
    return;
  }
  __assert_fail("pCut->nSize > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyCut.c"
                ,0x345,"void Ivy_NodePrintCut(Ivy_Cut_t *)");
}

Assistant:

void Ivy_NodePrintCut( Ivy_Cut_t * pCut )
{
    int i;
    assert( pCut->nSize > 0 );
    printf( "%d : {", pCut->nSize );
    for ( i = 0; i < pCut->nSize; i++ )
        printf( " %d", pCut->pArray[i] );
    printf( " }\n" );
}